

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O0

ON_BoundingBox * __thiscall
ON_SubDMeshFragmentIterator::ControlNetQuadBoundingBox
          (ON_BoundingBox *__return_storage_ptr__,ON_SubDMeshFragmentIterator *this)

{
  ON_BoundingBox local_108;
  ON_SubDMeshFragment *local_c8;
  ON_SubDMeshFragment *fragment;
  ON_SubDMeshFragmentIterator local_frit;
  ON_SubDMeshFragmentIterator *this_local;
  
  ON_BoundingBox::ON_BoundingBox(__return_storage_ptr__);
  if ((this->m_bFromFaceFragments & 1U) == 0) {
    ON_SubDMeshFragmentIterator((ON_SubDMeshFragmentIterator *)&fragment,this);
    local_c8 = FirstFragment((ON_SubDMeshFragmentIterator *)&fragment);
    while (local_c8 != (ON_SubDMeshFragment *)0x0) {
      ON_SubDMeshFragment::ControlNetQuadBoundingBox(&local_108,local_c8);
      ON_BoundingBox::Union(__return_storage_ptr__,&local_108);
      local_c8 = NextFragment((ON_SubDMeshFragmentIterator *)&fragment);
    }
    ~ON_SubDMeshFragmentIterator((ON_SubDMeshFragmentIterator *)&fragment);
  }
  else {
    ON_Geometry::BoundingBox
              ((ON_BoundingBox *)&local_frit.m_full_size_fragment_count,
               &(this->m_subd).super_ON_Geometry);
    memcpy(__return_storage_ptr__,&local_frit.m_full_size_fragment_count,0x30);
  }
  return __return_storage_ptr__;
}

Assistant:

const ON_BoundingBox ON_SubDMeshFragmentIterator::ControlNetQuadBoundingBox() const
{
  ON_BoundingBox bbox;
  if (m_bFromFaceFragments)
    bbox = m_subd.BoundingBox();
  else
  {
    ON_SubDMeshFragmentIterator local_frit(*this);
    for (const ON_SubDMeshFragment* fragment = local_frit.FirstFragment(); nullptr != fragment; fragment = local_frit.NextFragment())
    {
      bbox.Union(fragment->ControlNetQuadBoundingBox());
    }
  }
  return bbox;
}